

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_area_ratio_to_parcor_coefficients.cc
# Opt level: O0

bool __thiscall
sptk::LogAreaRatioToParcorCoefficients::Run
          (LogAreaRatioToParcorCoefficients *this,
          vector<double,_std::allocator<double>_> *log_area_ratio,
          vector<double,_std::allocator<double>_> *parcor_coefficients)

{
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var4;
  const_iterator cVar5;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var6;
  int iVar7;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *in_RDI;
  int length;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff88;
  value_type __n;
  size_type in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  
  iVar7 = *(int *)&in_RDI[1]._M_current + 1;
  if (((((ulong)in_RDI[1]._M_current & 0x100000000) == 0) ||
      (sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI), sVar1 != (long)iVar7)) ||
     (in_RDX == (vector<double,_std::allocator<double>_> *)0x0)) {
    return false;
  }
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
  if (sVar1 != (long)iVar7) {
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
  __n = *pvVar2;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
  *pvVar3 = __n;
  if (*(int *)&in_RDI[1]._M_current == 0) {
    return true;
  }
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff88);
  _Var4 = __gnu_cxx::
          __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator+(in_RDI,(difference_type)__n);
  cVar5 = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff88);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff88);
  _Var6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                    in_RDI,(difference_type)__n);
  std::
  transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::LogAreaRatioToParcorCoefficients::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*)const::__0>
            (_Var4._M_current,cVar5._M_current,_Var6._M_current);
  return true;
}

Assistant:

bool LogAreaRatioToParcorCoefficients::Run(
    const std::vector<double>& log_area_ratio,
    std::vector<double>* parcor_coefficients) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ || log_area_ratio.size() != static_cast<std::size_t>(length) ||
      NULL == parcor_coefficients) {
    return false;
  }

  // Prepare memories.
  if (parcor_coefficients->size() != static_cast<std::size_t>(length)) {
    parcor_coefficients->resize(length);
  }

  // Copy gain.
  (*parcor_coefficients)[0] = log_area_ratio[0];
  if (0 == num_order_) {
    return true;
  }

  std::transform(log_area_ratio.begin() + 1, log_area_ratio.end(),
                 parcor_coefficients->begin() + 1,
                 [](double g) { return std::tanh(0.5 * g); });

  return true;
}